

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void quantize_fs_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,
                       int num_rows)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  JSAMPLE *range_limit;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  int ci;
  int dirnc;
  int dir;
  int nc;
  int pixcode;
  JSAMPROW colormap_ci;
  JSAMPROW colorindex_ci;
  JSAMPROW output_ptr;
  JSAMPROW input_ptr;
  FSERRPTR errorptr;
  LOCFSERROR delta;
  LOCFSERROR bnexterr;
  LOCFSERROR bpreverr;
  LOCFSERROR belowerr;
  LOCFSERROR cur;
  my_cquantize_ptr cquantize;
  size_t in_stack_ffffffffffffff68;
  void *target;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  char *local_58;
  byte *local_50;
  short *local_48;
  int local_34;
  int local_30;
  int local_2c;
  
  lVar4 = *(long *)(in_RDI + 0x270);
  iVar2 = *(int *)(in_RDI + 0x90);
  iVar3 = *(int *)(in_RDI + 0x88);
  target = *(void **)(in_RDI + 0x1a8);
  for (local_80 = 0; local_80 < in_ECX; local_80 = local_80 + 1) {
    jzero_far(target,in_stack_ffffffffffffff68);
    for (local_7c = 0; local_7c < iVar2; local_7c = local_7c + 1) {
      local_50 = (byte *)(*(long *)(in_RSI + (long)local_80 * 8) + (long)local_7c);
      local_58 = *(char **)(in_RDX + (long)local_80 * 8);
      if (*(int *)(lVar4 + 0x90) == 0) {
        local_74 = 1;
        local_48 = *(short **)(lVar4 + 0x70 + (long)local_7c * 8);
        local_78 = iVar2;
      }
      else {
        local_50 = local_50 + (uint)((iVar3 + -1) * iVar2);
        local_58 = local_58 + (iVar3 - 1);
        local_74 = -1;
        local_48 = (short *)(*(long *)(lVar4 + 0x70 + (long)local_7c * 8) + (ulong)(iVar3 + 1) * 2);
        local_78 = -iVar2;
      }
      lVar5 = *(long *)(*(long *)(lVar4 + 0x30) + (long)local_7c * 8);
      lVar6 = *(long *)(*(long *)(lVar4 + 0x20) + (long)local_7c * 8);
      local_2c = 0;
      local_34 = 0;
      local_30 = 0;
      for (local_84 = iVar3; local_84 != 0; local_84 = local_84 + -1) {
        uVar7 = (uint)*(byte *)((long)target +
                               (long)(int)((uint)*local_50 +
                                          (local_2c + local_48[local_74] + 8 >> 4)));
        bVar1 = *(byte *)(lVar5 + (int)uVar7);
        *local_58 = *local_58 + bVar1;
        iVar8 = uVar7 - *(byte *)(lVar6 + (int)(uint)bVar1);
        *local_48 = (short)local_34 + (short)iVar8 * 3;
        local_34 = local_30 + iVar8 * 5;
        local_2c = iVar8 * 7;
        local_50 = local_50 + local_78;
        local_58 = local_58 + local_74;
        local_48 = local_48 + local_74;
        local_30 = iVar8;
      }
      *local_48 = (short)local_34;
    }
    *(uint *)(lVar4 + 0x90) = (uint)(*(int *)(lVar4 + 0x90) == 0);
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_fs_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                   JSAMPARRAY output_buf, int num_rows)
/* General case, with Floyd-Steinberg dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register LOCFSERROR cur;      /* current error or pixel value */
  LOCFSERROR belowerr;          /* error for pixel below cur */
  LOCFSERROR bpreverr;          /* error for below/prev col */
  LOCFSERROR bnexterr;          /* error for below/next col */
  LOCFSERROR delta;
  register FSERRPTR errorptr;   /* => fserrors[] at column before current */
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex_ci;
  JSAMPROW colormap_ci;
  int pixcode;
  int nc = cinfo->out_color_components;
  int dir;                      /* 1 for left-to-right, -1 for right-to-left */
  int dirnc;                    /* dir * nc */
  int ci;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  SHIFT_TEMPS

  for (row = 0; row < num_rows; row++) {
    /* Initialize output values to 0 so can process components separately */
    jzero_far((void *)output_buf[row], (size_t)(width * sizeof(JSAMPLE)));
    for (ci = 0; ci < nc; ci++) {
      input_ptr = input_buf[row] + ci;
      output_ptr = output_buf[row];
      if (cquantize->on_odd_row) {
        /* work right to left in this row */
        input_ptr += (width - 1) * nc; /* so point to rightmost pixel */
        output_ptr += width - 1;
        dir = -1;
        dirnc = -nc;
        errorptr = cquantize->fserrors[ci] + (width + 1); /* => entry after last column */
      } else {
        /* work left to right in this row */
        dir = 1;
        dirnc = nc;
        errorptr = cquantize->fserrors[ci]; /* => entry before first column */
      }
      colorindex_ci = cquantize->colorindex[ci];
      colormap_ci = cquantize->sv_colormap[ci];
      /* Preset error values: no error propagated to first pixel from left */
      cur = 0;
      /* and no error propagated to row below yet */
      belowerr = bpreverr = 0;

      for (col = width; col > 0; col--) {
        /* cur holds the error propagated from the previous pixel on the
         * current line.  Add the error propagated from the previous line
         * to form the complete error correction term for this pixel, and
         * round the error term (which is expressed * 16) to an integer.
         * RIGHT_SHIFT rounds towards minus infinity, so adding 8 is correct
         * for either sign of the error value.
         * Note: errorptr points to *previous* column's array entry.
         */
        cur = RIGHT_SHIFT(cur + errorptr[dir] + 8, 4);
        /* Form pixel value + error, and range-limit to 0..MAXJSAMPLE.
         * The maximum error is +- MAXJSAMPLE; this sets the required size
         * of the range_limit array.
         */
        cur += *input_ptr;
        cur = range_limit[cur];
        /* Select output value, accumulate into output code for this pixel */
        pixcode = colorindex_ci[cur];
        *output_ptr += (JSAMPLE)pixcode;
        /* Compute actual representation error at this pixel */
        /* Note: we can do this even though we don't have the final */
        /* pixel code, because the colormap is orthogonal. */
        cur -= colormap_ci[pixcode];
        /* Compute error fractions to be propagated to adjacent pixels.
         * Add these into the running sums, and simultaneously shift the
         * next-line error sums left by 1 column.
         */
        bnexterr = cur;
        delta = cur * 2;
        cur += delta;           /* form error * 3 */
        errorptr[0] = (FSERROR)(bpreverr + cur);
        cur += delta;           /* form error * 5 */
        bpreverr = belowerr + cur;
        belowerr = bnexterr;
        cur += delta;           /* form error * 7 */
        /* At this point cur contains the 7/16 error value to be propagated
         * to the next pixel on the current line, and all the errors for the
         * next line have been shifted over. We are therefore ready to move on.
         */
        input_ptr += dirnc;     /* advance input ptr to next column */
        output_ptr += dir;      /* advance output ptr to next column */
        errorptr += dir;        /* advance errorptr to current column */
      }
      /* Post-loop cleanup: we must unload the final error value into the
       * final fserrors[] entry.  Note we need not unload belowerr because
       * it is for the dummy column before or after the actual array.
       */
      errorptr[0] = (FSERROR)bpreverr; /* unload prev err into array */
    }
    cquantize->on_odd_row = (cquantize->on_odd_row ? FALSE : TRUE);
  }
}